

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  size_t sVar6;
  ostream *poVar7;
  PolicyID id;
  pointer pcVar8;
  pointer pbVar9;
  string moduleInCMakeRoot;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string moduleInCMakeModulePath;
  string itempl;
  undefined1 auStack_278 [8];
  string *local_270;
  string local_268;
  undefined1 local_248 [40];
  cmMakefile *local_220;
  bool *local_218;
  string local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  local_1a8._0_8_ = local_1a8 + 0x10;
  local_270 = __return_storage_ptr__;
  local_218 = system;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MODULE_PATH","");
  local_220 = this;
  psVar5 = GetDef(this,(string *)local_1a8);
  if (psVar5 == (string *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (psVar5->_M_dataplus)._M_p;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar8 != (char *)0x0) {
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_248._16_8_ = (pointer)0x0;
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar6 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar6);
    cmSystemTools::ExpandListArgument
              ((string *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar2 = local_248._8_8_;
    if (local_248._0_8_ != local_248._8_8_) {
      pbVar9 = (pointer)local_248._0_8_;
      do {
        while( true ) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          pcVar8 = (pbVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar8,pcVar8 + pbVar9->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1a8);
          std::__cxx11::string::append((char *)local_1a8);
          std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(filename->_M_dataplus)._M_p);
          bVar3 = cmsys::SystemTools::FileExists((string *)local_1a8);
          if (!bVar3) break;
          std::__cxx11::string::_M_assign((string *)&local_1e8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar9 = pbVar9 + 1;
          if (bVar3 || pbVar9 == (pointer)uVar2) goto LAB_00189978;
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (pointer)uVar2);
    }
LAB_00189978:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
  }
  cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&local_268);
  std::__cxx11::string::append((char *)&local_268);
  std::__cxx11::string::_M_append((char *)&local_268,(ulong)(filename->_M_dataplus)._M_p);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_268);
  bVar3 = cmsys::SystemTools::FileExists(&local_268);
  if (!bVar3) {
    local_268._M_string_length = 0;
    *local_268._M_dataplus._M_p = '\0';
  }
  *local_218 = false;
  std::__cxx11::string::_M_assign((string *)local_270);
  if (local_270->_M_string_length == 0) {
    *local_218 = true;
    std::__cxx11::string::_M_assign((string *)local_270);
  }
  if ((local_1e0 == 0) || (local_268._M_string_length == 0)) goto LAB_00189d30;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  psVar5 = GetDef(local_220,(string *)local_1a8);
  if (psVar5 == (string *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (psVar5->_M_dataplus)._M_p;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  local_248._0_8_ = (pointer)(local_248 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar1,pcVar1 + psVar5->_M_string_length);
  std::__cxx11::string::append(local_248);
  if (pcVar8 == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    sVar6 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar8,pcVar8 + sVar6);
    bVar3 = cmsys::SystemTools::IsSubDirectory(&local_1c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 != false) {
    PVar4 = cmStateSnapshot::GetPolicy(&local_220->StateSnapshot,CMP0017,false);
    if (PVar4 - NEW < 3) {
      bVar3 = true;
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_00189d19;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)auStack_278 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0xd0);
        }
        else {
          sVar6 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," includes ",10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," (found via CMAKE_MODULE_PATH) which shadows ",0x2d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,". This may cause errors later on .\n",0x23);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x11,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,local_210._M_dataplus._M_p,local_210._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        IssueMessage(local_220,AUTHOR_WARNING,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar3 = false;
    }
    *local_218 = bVar3;
    std::__cxx11::string::_M_assign((string *)local_270);
  }
LAB_00189d19:
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
LAB_00189d30:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  return local_270;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}